

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceRepetition::serializeTo(SequenceRepetition *this,ASTSerializer *serializer)

{
  Kind KVar1;
  ASTSerializer *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  SequenceRepetition *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  ASTSerializer::startObject(serializer);
  this_00 = local_18;
  KVar1 = this->kind;
  if (KVar1 == Consecutive) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"kind");
    local_38 = sv("Consecutive",0xb);
    ASTSerializer::write(this_00,(int)local_28._M_len,local_28._M_str,local_38._M_len);
  }
  else if (KVar1 == Nonconsecutive) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"kind");
    local_58 = sv("Nonconsecutive",0xe);
    ASTSerializer::write(this_00,(int)local_48._M_len,local_48._M_str,local_58._M_len);
  }
  else if (KVar1 == GoTo) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"kind");
    bVar2 = sv("GoTo",4);
    local_78 = bVar2._M_len;
    ASTSerializer::write(this_00,(int)local_68._M_len,local_68._M_str,local_78);
  }
  SequenceRange::serializeTo(&this->range,local_18);
  ASTSerializer::endObject(local_18);
  return;
}

Assistant:

void SequenceRepetition::serializeTo(ASTSerializer& serializer) const {
    serializer.startObject();

    switch (kind) {
        case Consecutive:
            serializer.write("kind", "Consecutive"sv);
            break;
        case Nonconsecutive:
            serializer.write("kind", "Nonconsecutive"sv);
            break;
        case GoTo:
            serializer.write("kind", "GoTo"sv);
            break;
    }

    range.serializeTo(serializer);
    serializer.endObject();
}